

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  int iVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  Extension *pEVar4;
  
  if (this->flat_size_ == 0) {
    pEVar4 = (Extension *)0x0;
  }
  else {
    if ((short)this->flat_size_ < 0) {
      pEVar4 = FindOrNullInLargeMap(this,key);
      return pEVar4;
    }
    pKVar2 = flat_begin(this);
    pKVar3 = flat_end(this);
    while( true ) {
      if (pKVar2 == pKVar3) {
        return (Extension *)0x0;
      }
      iVar1 = pKVar2->first;
      if (iVar1 != key && key <= iVar1) {
        return (Extension *)0x0;
      }
      if (iVar1 == key) break;
      pKVar2 = pKVar2 + 1;
    }
    pEVar4 = &pKVar2->second;
  }
  return pEVar4;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (flat_size_ == 0) {
    return nullptr;
  } else if (ABSL_PREDICT_TRUE(!is_large())) {
    for (auto it = flat_begin(), end = flat_end();
         it != end && it->first <= key; ++it) {
      if (it->first == key) return &it->second;
    }
    return nullptr;
  } else {
    return FindOrNullInLargeMap(key);
  }
}